

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O3

void Rml::StringUtilities::ExpandString(StringList *string_list,String *string,char delimiter)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  byte *pbVar4;
  bool bVar5;
  char *pcVar6;
  char *pcVar7;
  byte *pbVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte *pbVar14;
  StringView string_00;
  char *start_ptr;
  byte *local_70;
  byte *local_68;
  String local_60;
  StringView local_40;
  
  pbVar12 = (byte *)(string->_M_dataplus)._M_p;
  local_70 = (byte *)0x0;
  pcVar6 = (char *)string->_M_string_length;
  if (pcVar6 != (char *)0x0) {
    pcVar7 = (char *)0x0;
    lVar3 = 0;
    do {
      lVar3 = lVar3 + (ulong)(pbVar12[(long)pcVar7] == delimiter);
      pcVar7 = pcVar7 + 1;
    } while (pcVar6 != pcVar7);
    if (lVar3 != 0) {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)string_list,
                lVar3 + ((long)(string_list->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(string_list->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
      bVar2 = *pbVar12;
      if (bVar2 == 0) {
        return;
      }
      bVar5 = true;
      pbVar4 = (byte *)0x0;
      pbVar8 = (byte *)0x0;
      uVar9 = 0;
      pbVar13 = pbVar12;
      do {
        pbVar1 = pbVar12 + 1;
        uVar11 = uVar9;
        pbVar14 = pbVar13;
        local_68 = pbVar12;
        while( true ) {
          uVar9 = (ulong)bVar2;
          pbVar13 = pbVar14 + 1;
          bVar10 = (byte)uVar11;
          pbVar12 = local_68;
          if (((bVar5) && (bVar10 == 0)) && ((bVar2 == 0x22 || (bVar2 == 0x27)))) goto LAB_00264e65;
          if (bVar2 == bVar10) break;
          if ((bVar2 != delimiter) || (bVar10 != 0)) goto LAB_00264e1d;
          if (pbVar8 == (byte *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)string_list);
          }
          else {
            local_60._M_dataplus._M_p = (pointer)pbVar1;
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&,char_const*>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       string_list,(char **)&local_70,(char **)&local_60);
          }
          local_70 = (byte *)0x0;
          bVar2 = *pbVar13;
          pbVar4 = (byte *)0x0;
          bVar5 = true;
          pbVar8 = (byte *)0x0;
          uVar11 = 0;
          pbVar14 = pbVar13;
          if (bVar2 == 0) {
            return;
          }
        }
        if (pbVar14[-1] != 0x5c) goto LAB_00264e4d;
LAB_00264e1d:
        if ((bVar2 < 0x21) && (((0x100002600U >> (uVar9 & 0x3f) & 1) != 0 && (bVar10 == 0)))) {
LAB_00264e4d:
          uVar9 = 0;
        }
        else {
          pbVar8 = pbVar14;
          pbVar12 = pbVar14;
          if (pbVar4 != (byte *)0x0) {
            pbVar8 = pbVar4;
            pbVar12 = local_70;
          }
          local_70 = pbVar12;
          bVar5 = false;
          pbVar4 = pbVar8;
          uVar9 = uVar11;
          pbVar12 = pbVar14;
        }
LAB_00264e65:
        bVar2 = *pbVar13;
        if (bVar2 == 0) {
          if (pbVar4 == (byte *)0x0) {
            return;
          }
          local_60._M_dataplus._M_p = (pointer)(pbVar12 + 1);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&,char_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     string_list,(char **)&local_70,(char **)&local_60);
          return;
        }
      } while( true );
    }
  }
  StringView::StringView(&local_40,string);
  string_00.p_end = pcVar6;
  string_00.p_begin = local_40.p_end;
  StripWhitespace_abi_cxx11_(&local_60,(StringUtilities *)local_40.p_begin,string_00);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)string_list,
             &local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void StringUtilities::ExpandString(StringList& string_list, const String& string, const char delimiter)
{
	char quote = 0;
	bool last_char_delimiter = true;
	const char* ptr = string.c_str();
	const char* start_ptr = nullptr;
	const char* end_ptr = ptr;

	size_t num_delimiter_values = std::count(string.begin(), string.end(), delimiter);
	if (num_delimiter_values == 0)
	{
		string_list.push_back(StripWhitespace(string));
		return;
	}
	string_list.reserve(string_list.size() + num_delimiter_values + 1);

	while (*ptr)
	{
		// Switch into quote mode if the last char was a delimeter ( excluding whitespace )
		// and we're not already in quote mode
		if (last_char_delimiter && !quote && (*ptr == '"' || *ptr == '\''))
		{
			quote = *ptr;
		}
		// Switch out of quote mode if we encounter a quote that hasn't been escaped
		else if (*ptr == quote && *(ptr - 1) != '\\')
		{
			quote = 0;
		}
		// If we encounter a delimiter while not in quote mode, add the item to the list
		else if (*ptr == delimiter && !quote)
		{
			if (start_ptr)
				string_list.emplace_back(start_ptr, end_ptr + 1);
			else
				string_list.emplace_back();
			last_char_delimiter = true;
			start_ptr = nullptr;
		}
		// Otherwise if its not white space or we're in quote mode, advance the pointers
		else if (!IsWhitespace(*ptr) || quote)
		{
			if (!start_ptr)
				start_ptr = ptr;
			end_ptr = ptr;
			last_char_delimiter = false;
		}

		ptr++;
	}

	// If there's data pending, add it.
	if (start_ptr)
		string_list.emplace_back(start_ptr, end_ptr + 1);
}